

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall doctest::String::operator=(String *this,String *other)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (this != other) {
    if (((this->field_0).buf[0x17] < '\0') &&
       (pcVar1 = (this->field_0).data.ptr, pcVar1 != (char *)0x0)) {
      operator_delete__(pcVar1);
    }
    *(undefined8 *)((long)&this->field_0 + 0x10) = *(undefined8 *)((long)&other->field_0 + 0x10);
    uVar2 = *(undefined8 *)((long)&other->field_0 + 8);
    (this->field_0).data.ptr = (other->field_0).data.ptr;
    *(undefined8 *)((long)&this->field_0 + 8) = uVar2;
    (other->field_0).buf[0] = '\0';
    (other->field_0).buf[0x17] = '\x17';
  }
  return this;
}

Assistant:

String& String::operator=(String&& other) {
    using namespace std;
    if(this != &other) {
        if(!isOnStack())
            delete[] data.ptr;
        memcpy(buf, other.buf, len);
        other.buf[0] = '\0';
        other.setLast();
    }
    return *this;
}